

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

void uv__signal_event(uv_loop_t *loop,uv__io_t *w,uint events)

{
  uv_signal_t *handle;
  uint uVar1;
  ssize_t sVar2;
  int *piVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  char buf [512];
  undefined8 local_238;
  int aiStack_230 [128];
  
  uVar5 = 0;
  uVar6 = 0;
  do {
    sVar2 = read(loop->signal_pipefd[0],(void *)((long)aiStack_230 + (uVar6 - 8)),0x200 - uVar6);
    if ((int)sVar2 == -1) {
      piVar3 = __errno_location();
      if (*piVar3 != 4) {
        if (*piVar3 != 0xb) {
          abort();
        }
        if (uVar6 == 0) {
          return;
        }
      }
    }
    else {
      uVar6 = (long)(int)sVar2 + uVar6;
      uVar5 = uVar6 & 0xfffffffffffffff0;
      if (uVar5 != 0) {
        uVar4 = 0;
        do {
          handle = *(uv_signal_t **)((long)aiStack_230 + (uVar4 - 8));
          if (*(int *)((long)aiStack_230 + uVar4) == handle->signum) {
            if ((handle->flags & 1) != 0) {
              __assert_fail("!(handle->flags & UV_CLOSING)",
                            "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/signal.c"
                            ,0x1c5,"void uv__signal_event(uv_loop_t *, uv__io_t *, unsigned int)");
            }
            (*handle->signal_cb)(handle,*(int *)((long)aiStack_230 + uVar4));
          }
          handle->dispatched_signals = handle->dispatched_signals + 1;
          uVar1 = handle->flags;
          if ((uVar1 >> 0x13 & 1) != 0) {
            uv__signal_stop(handle);
            uVar1 = handle->flags;
          }
          if (((uVar1 & 1) != 0) && (handle->caught_signals == handle->dispatched_signals)) {
            uv__make_close_pending((uv_handle_t *)handle);
          }
          uVar4 = uVar4 + 0x10;
        } while (uVar4 < uVar5);
      }
      uVar6 = uVar6 & 0xf;
      if (uVar6 == 0) {
        uVar6 = 0;
      }
      else {
        memmove(&local_238,(void *)((long)aiStack_230 + (uVar5 - 8)),uVar6);
      }
    }
    bVar7 = uVar5 != 0x200;
    uVar5 = 0x200;
    if (bVar7) {
      return;
    }
  } while( true );
}

Assistant:

static void uv__signal_event(uv_loop_t* loop,
                             uv__io_t* w,
                             unsigned int events) {
  uv__signal_msg_t* msg;
  uv_signal_t* handle;
  char buf[sizeof(uv__signal_msg_t) * 32];
  size_t bytes, end, i;
  int r;

  bytes = 0;
  end = 0;

  do {
    r = read(loop->signal_pipefd[0], buf + bytes, sizeof(buf) - bytes);

    if (r == -1 && errno == EINTR)
      continue;

    if (r == -1 && (errno == EAGAIN || errno == EWOULDBLOCK)) {
      /* If there are bytes in the buffer already (which really is extremely
       * unlikely if possible at all) we can't exit the function here. We'll
       * spin until more bytes are read instead.
       */
      if (bytes > 0)
        continue;

      /* Otherwise, there was nothing there. */
      return;
    }

    /* Other errors really should never happen. */
    if (r == -1)
      abort();

    bytes += r;

    /* `end` is rounded down to a multiple of sizeof(uv__signal_msg_t). */
    end = (bytes / sizeof(uv__signal_msg_t)) * sizeof(uv__signal_msg_t);

    for (i = 0; i < end; i += sizeof(uv__signal_msg_t)) {
      msg = (uv__signal_msg_t*) (buf + i);
      handle = msg->handle;

      if (msg->signum == handle->signum) {
        assert(!(handle->flags & UV_CLOSING));
        handle->signal_cb(handle, handle->signum);
      }

      handle->dispatched_signals++;

      if (handle->flags & UV__SIGNAL_ONE_SHOT)
        uv__signal_stop(handle);

      /* If uv_close was called while there were caught signals that were not
       * yet dispatched, the uv__finish_close was deferred. Make close pending
       * now if this has happened.
       */
      if ((handle->flags & UV_CLOSING) &&
          (handle->caught_signals == handle->dispatched_signals)) {
        uv__make_close_pending((uv_handle_t*) handle);
      }
    }

    bytes -= end;

    /* If there are any "partial" messages left, move them to the start of the
     * the buffer, and spin. This should not happen.
     */
    if (bytes) {
      memmove(buf, buf + end, bytes);
      continue;
    }
  } while (end == sizeof buf);
}